

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagonal_precond.cc
# Opt level: O0

void __thiscall
ipx::DiagonalPrecond::_Apply(DiagonalPrecond *this,Vector *rhs,Vector *lhs,double *rhs_dot_lhs)

{
  Int IVar1;
  double *pdVar2;
  double *in_RCX;
  valarray<double> *in_RDX;
  valarray<double> *in_RSI;
  long in_RDI;
  double dVar3;
  Int i;
  Timer timer;
  double rldot;
  Int m;
  Timer *in_stack_ffffffffffffffa0;
  undefined4 local_3c;
  undefined8 local_30;
  
  IVar1 = Model::rows(*(Model **)(in_RDI + 8));
  local_30 = 0.0;
  Timer::Timer(in_stack_ffffffffffffffa0);
  for (local_3c = 0; local_3c < IVar1; local_3c = local_3c + 1) {
    pdVar2 = std::valarray<double>::operator[](in_RSI,(long)local_3c);
    in_stack_ffffffffffffffa0 = (Timer *)*pdVar2;
    pdVar2 = std::valarray<double>::operator[]((valarray<double> *)(in_RDI + 0x18),(long)local_3c);
    dVar3 = (double)in_stack_ffffffffffffffa0 / *pdVar2;
    pdVar2 = std::valarray<double>::operator[](in_RDX,(long)local_3c);
    *pdVar2 = dVar3;
    pdVar2 = std::valarray<double>::operator[](in_RDX,(long)local_3c);
    dVar3 = *pdVar2;
    pdVar2 = std::valarray<double>::operator[](in_RSI,(long)local_3c);
    local_30 = dVar3 * *pdVar2 + local_30;
  }
  if (in_RCX != (double *)0x0) {
    *in_RCX = local_30;
  }
  dVar3 = Timer::Elapsed(in_stack_ffffffffffffffa0);
  *(double *)(in_RDI + 0x28) = dVar3 + *(double *)(in_RDI + 0x28);
  return;
}

Assistant:

void DiagonalPrecond::_Apply(const Vector& rhs, Vector& lhs,
                              double* rhs_dot_lhs) {
    const Int m = model_.rows();
    double rldot = 0.0;
    Timer timer;

    assert(factorized_);
    assert(lhs.size() == static_cast<size_t>(m));
    assert(rhs.size() == static_cast<size_t>(m));

    for (Int i = 0; i < m; i++) {
        lhs[i] = rhs[i] / diagonal_[i];
        rldot += lhs[i] * rhs[i];
    }
    if (rhs_dot_lhs)
        *rhs_dot_lhs = rldot;
    time_ += timer.Elapsed();
}